

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::WriteFolderTargets(cmGlobalNinjaGenerator *this,ostream *os)

{
  _Base_ptr p_Var1;
  _Rb_tree_node_base *p_Var2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  size_type sVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Base_ptr p_Var7;
  undefined4 extraout_var_01;
  _Base_ptr p_Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  pointer pbVar9;
  pointer pbVar10;
  Target *t;
  string buildDirAllTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmNinjaDeps configDeps;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
  dirTargets;
  cmNinjaBuild build;
  cmAlphaNum local_2b0;
  string local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  _Rb_tree_node_base *local_248;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_240;
  _Rb_tree_node_base *local_238;
  key_type *local_230;
  cmAlphaNum local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  string local_1e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
  local_1c0;
  undefined1 local_190 [136];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108 [6];
  string local_70;
  string local_50;
  ostream *os_00;
  
  WriteDivider(os);
  std::operator<<(os,"# Folder targets.\n\n");
  cmGlobalCommonGenerator::ComputeDirectoryTargets_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
              *)&local_1c0,&this->super_cmGlobalCommonGenerator);
  local_240 = &this->CrossConfigs;
  local_248 = &(this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_238 = &(this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var8 = local_1c0._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var8 == &local_1c0._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
      ::~_Rb_tree(&local_1c0);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"phony",(allocator<char> *)&local_2b0);
    cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_190,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    WriteDivider(os);
    cmMakefile::GetGeneratorConfigs_abi_cxx11_
              (&local_260,*(cmMakefile **)(*(long *)(p_Var8 + 2) + 0x70),IncludeEmptyConfig);
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b0.View_._M_len = 8;
    local_2b0.View_._M_str = "Folder: ";
    local_228.View_._M_str = *(char **)(p_Var8 + 1);
    local_228.View_._M_len = (size_t)p_Var8[1]._M_parent;
    cmStrCat<>(&local_280,&local_2b0,&local_228);
    std::__cxx11::string::operator=((string *)local_190,(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_190 + 0x40));
    local_2b0.View_._M_str = *(char **)(p_Var8 + 1);
    local_2b0.View_._M_len = (size_t)p_Var8[1]._M_parent;
    local_228.View_._M_len = 4;
    local_228.View_._M_str = "/all";
    cmStrCat<>(&local_1e0,&local_2b0,&local_228);
    psVar5 = ConvertToNinjaPath(this,&local_1e0);
    std::__cxx11::string::string((string *)&local_280,(string *)psVar5);
    std::__cxx11::string::~string((string *)&local_1e0);
    local_230 = local_260.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar9 = local_260.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar9 != local_230;
        pbVar9 = pbVar9 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(local_108);
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x48])
                (&local_2b0,this,&local_280);
      std::__cxx11::string::operator=((string *)local_190._64_8_,(string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_190._64_8_);
      p_Var1 = p_Var8[2]._M_left;
      for (p_Var7 = p_Var8[2]._M_parent; p_Var7 != p_Var1; p_Var7 = p_Var7 + 1) {
        bVar3 = cmGlobalCommonGenerator::IsExcludedFromAllInConfig
                          (&this->super_cmGlobalCommonGenerator,(Target *)p_Var7,pbVar9);
        if (!bVar3) {
          AppendTargetOutputs(this,*(cmGeneratorTarget **)p_Var7,local_108,pbVar9,
                              DependOnTargetArtifact);
        }
      }
      p_Var1 = p_Var8[3]._M_parent;
      for (p_Var7 = *(_Base_ptr *)(p_Var8 + 3); p_Var7 != p_Var1;
          p_Var7 = (_Base_ptr)&p_Var7[1]._M_parent) {
        if ((char)p_Var7[1]._M_color == _S_red) {
          local_2b0.View_._M_str = *(char **)p_Var7;
          local_2b0.View_._M_len = (size_t)p_Var7->_M_parent;
          local_228.View_._M_len = 4;
          local_228.View_._M_str = "/all";
          cmStrCat<>(&local_70,&local_2b0,&local_228);
          psVar5 = ConvertToNinjaPath(this,&local_70);
          (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x48])(&local_1e0,this,psVar5);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_108,
                     &local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_70);
        }
      }
      if ((this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_0027b61e:
        iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x41])(this,pbVar9);
        os_00 = (ostream *)CONCAT44(extraout_var,iVar4);
      }
      else {
        sVar6 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(local_240,pbVar9);
        os_00 = os;
        if (sVar6 == 0) goto LAB_0027b61e;
      }
      WriteBuild(this,os_00,(cmNinjaBuild *)local_190,0,(bool *)0x0);
    }
    iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x26])(this);
    pbVar9 = local_260.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((char)iVar4 != '\0') {
      for (pbVar10 = local_260.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; p_Var2 = local_248,
          pbVar10 != pbVar9; pbVar10 = pbVar10 + 1) {
        (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
          [0x48])(&local_2b0,this,&local_280);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_108,
                   &local_2b0,local_2b0.Digits_ + 0x10);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::_M_assign((string *)local_190._64_8_);
        iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x42])(this,pbVar10);
        WriteBuild(this,(ostream *)CONCAT44(extraout_var_00,iVar4),(cmNinjaBuild *)local_190,0,
                   (bool *)0x0);
      }
      if ((this->DefaultFileConfig)._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(local_108);
        for (p_Var7 = (this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            p_Var7 != p_Var2; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
          (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x48])(&local_2b0,this,&local_280);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b0
                    );
          std::__cxx11::string::~string((string *)&local_2b0);
        }
        std::__cxx11::string::_M_assign((string *)local_190._64_8_);
        iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x43])(this);
        WriteBuild(this,(ostream *)CONCAT44(extraout_var_01,iVar4),(cmNinjaBuild *)local_190,0,
                   (bool *)0x0);
      }
    }
    if ((this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(local_108);
      for (p_Var7 = (this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var7 != local_238; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
          [0x48])(&local_2b0,this,&local_280,p_Var7 + 1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"all",(allocator<char> *)&local_1e0);
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x48])
                (&local_2b0,this,&local_280);
      std::__cxx11::string::operator=((string *)local_190._64_8_,(string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_228);
      WriteBuild(this,os,(cmNinjaBuild *)local_190,0,(bool *)0x0);
    }
    std::__cxx11::string::~string((string *)&local_280);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_260);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_190);
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

void cmGlobalNinjaGenerator::WriteFolderTargets(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Folder targets.\n\n";

  std::map<std::string, DirectoryTarget> dirTargets =
    this->ComputeDirectoryTargets();

  for (auto const& it : dirTargets) {
    cmNinjaBuild build("phony");
    cmGlobalNinjaGenerator::WriteDivider(os);
    std::string const& currentBinaryDir = it.first;
    DirectoryTarget const& dt = it.second;
    std::vector<std::string> configs =
      dt.LG->GetMakefile()->GetGeneratorConfigs(
        cmMakefile::IncludeEmptyConfig);

    // Setup target
    cmNinjaDeps configDeps;
    build.Comment = cmStrCat("Folder: ", currentBinaryDir);
    build.Outputs.emplace_back();
    std::string const buildDirAllTarget =
      this->ConvertToNinjaPath(cmStrCat(currentBinaryDir, "/all"));
    for (auto const& config : configs) {
      build.ExplicitDeps.clear();
      build.Outputs.front() = this->BuildAlias(buildDirAllTarget, config);
      configDeps.emplace_back(build.Outputs.front());
      for (DirectoryTarget::Target const& t : dt.Targets) {
        if (!this->IsExcludedFromAllInConfig(t, config)) {
          this->AppendTargetOutputs(t.GT, build.ExplicitDeps, config,
                                    DependOnTargetArtifact);
        }
      }
      for (DirectoryTarget::Dir const& d : dt.Children) {
        if (!d.ExcludeFromAll) {
          build.ExplicitDeps.emplace_back(this->BuildAlias(
            this->ConvertToNinjaPath(cmStrCat(d.Path, "/all")), config));
        }
      }
      // Write target
      this->WriteBuild(this->EnableCrossConfigBuild() &&
                           this->CrossConfigs.count(config)
                         ? os
                         : *this->GetImplFileStream(config),
                       build);
    }

    // Add shortcut target
    if (this->IsMultiConfig()) {
      for (auto const& config : configs) {
        build.ExplicitDeps = { this->BuildAlias(buildDirAllTarget, config) };
        build.Outputs.front() = buildDirAllTarget;
        this->WriteBuild(*this->GetConfigFileStream(config), build);
      }

      if (!this->DefaultFileConfig.empty()) {
        build.ExplicitDeps.clear();
        for (auto const& config : this->DefaultConfigs) {
          build.ExplicitDeps.push_back(
            this->BuildAlias(buildDirAllTarget, config));
        }
        build.Outputs.front() = buildDirAllTarget;
        this->WriteBuild(*this->GetDefaultFileStream(), build);
      }
    }

    // Add target for all configs
    if (this->EnableCrossConfigBuild()) {
      build.ExplicitDeps.clear();
      for (auto const& config : this->CrossConfigs) {
        build.ExplicitDeps.push_back(
          this->BuildAlias(buildDirAllTarget, config));
      }
      build.Outputs.front() = this->BuildAlias(buildDirAllTarget, "all");
      this->WriteBuild(os, build);
    }
  }
}